

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getXYarea(Snapshot *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint i;
  Mat3x3d *pMVar6;
  double *pdVar7;
  uint j;
  long lVar8;
  double tmp;
  double dVar9;
  Vector<double,_3U> v;
  double local_28 [4];
  
  if (this->hasXYarea == false) {
    pMVar6 = &(this->frameData).hmat;
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    lVar8 = 0;
    do {
      local_28[lVar8] =
           (pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
      dVar5 = local_28[2];
      dVar4 = local_28[1];
      dVar2 = local_28[0];
      lVar8 = lVar8 + 1;
      pMVar6 = (Mat3x3d *)
               ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar8 != 3);
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    pdVar7 = (this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
             data_[0] + 1;
    lVar8 = 0;
    do {
      local_28[lVar8] = *pdVar7;
      dVar3 = local_28[0];
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar8 != 3);
    dVar1 = dVar2 * local_28[1];
    dVar9 = local_28[0] * dVar5;
    local_28[0] = local_28[2] * dVar4 - dVar5 * local_28[1];
    local_28[1] = dVar9 - dVar2 * local_28[2];
    local_28[2] = dVar1 - dVar3 * dVar4;
    dVar2 = 0.0;
    lVar8 = 0;
    do {
      dVar2 = dVar2 + local_28[lVar8] * local_28[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    (this->frameData).xyArea = dVar2;
    this->hasXYarea = true;
  }
  return (this->frameData).xyArea;
}

Assistant:

RealType Snapshot::getXYarea() {
    if (!hasXYarea) {
      Vector3d x       = frameData.hmat.getColumn(0);
      Vector3d y       = frameData.hmat.getColumn(1);
      frameData.xyArea = cross(x, y).length();
      hasXYarea        = true;
    }
    return frameData.xyArea;
  }